

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ColorMaskCase::iterate(ColorMaskCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestLog *pTVar3;
  byte bVar4;
  int iVar5;
  GLenum err;
  undefined4 extraout_var;
  GLuint GVar6;
  uint index;
  deInt32 maxDrawBuffers;
  ScopedLogSection section;
  CallLogWrapper gl;
  ResultCollector result;
  GLint local_e4;
  ScopedLogSection local_e0;
  string local_d8;
  string local_b8;
  CallLogWrapper local_98;
  ResultCollector local_80;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_98,(Functions *)CONCAT44(extraout_var,iVar5),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  paVar1 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_80,pTVar3,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_e4 = 0;
  local_98.m_enableLog = true;
  glu::CallLogWrapper::glGetIntegerv(&local_98,0x8824,&local_e4);
  err = glu::CallLogWrapper::glGetError(&local_98);
  glu::checkError(err,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x3cc);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Initial","");
  paVar2 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Initial value","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e0,pTVar3,&local_d8,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (0 < local_e4) {
    iVar5 = 0;
    do {
      local_d8._M_dataplus._M_p._0_4_ = 0x1010101;
      deqp::gls::StateQueryUtil::verifyStateIndexedBooleanVec4
                (&local_80,&local_98,0xc23,iVar5,(BVec4 *)&local_d8,this->m_verifierType);
      iVar5 = iVar5 + 1;
    } while (iVar5 < local_e4);
  }
  tcu::TestLog::endSection(local_e0.m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"AfterSettingCommon","");
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"After setting common","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e0,pTVar3,&local_d8,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glColorMask(&local_98,'\0','\x01','\x01','\0');
  if (0 < local_e4) {
    iVar5 = 0;
    do {
      local_d8._M_dataplus._M_p._0_4_ = 0x10100;
      deqp::gls::StateQueryUtil::verifyStateIndexedBooleanVec4
                (&local_80,&local_98,0xc23,iVar5,(BVec4 *)&local_d8,this->m_verifierType);
      iVar5 = iVar5 + 1;
    } while (iVar5 < local_e4);
  }
  tcu::TestLog::endSection(local_e0.m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"AfterSettingIndexed","");
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"After setting indexed","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e0,pTVar3,&local_d8,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (0 < local_e4) {
    GVar6 = 0;
    do {
      bVar4 = (byte)GVar6 & 1;
      glu::CallLogWrapper::glColorMaski(&local_98,GVar6,bVar4 ^ 1,bVar4,bVar4 ^ 1,bVar4);
      GVar6 = GVar6 + 1;
    } while ((int)GVar6 < local_e4);
  }
  if (0 < local_e4) {
    index = 0;
    do {
      if ((index & 1) == 0) {
        local_d8._M_dataplus._M_p._0_4_ = 0x10001;
      }
      else {
        local_d8._M_dataplus._M_p._0_4_ = 0x1000100;
      }
      deqp::gls::StateQueryUtil::verifyStateIndexedBooleanVec4
                (&local_80,&local_98,0xc23,index,(BVec4 *)&local_d8,this->m_verifierType);
      index = index + 1;
    } while ((int)index < local_e4);
  }
  tcu::TestLog::endSection(local_e0.m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"AfterResettingIndexedWithCommon","");
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"After resetting indexed with common","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e0,pTVar3,&local_d8,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (0 < local_e4) {
    GVar6 = 0;
    do {
      bVar4 = (byte)GVar6 & 1;
      glu::CallLogWrapper::glColorMaski(&local_98,GVar6,bVar4 ^ 1,bVar4,bVar4 ^ 1,bVar4);
      GVar6 = GVar6 + 1;
    } while ((int)GVar6 < local_e4);
  }
  glu::CallLogWrapper::glColorMask(&local_98,'\0','\x01','\x01','\0');
  if (0 < local_e4) {
    iVar5 = 0;
    do {
      local_d8._M_dataplus._M_p._0_4_ = 0x10100;
      deqp::gls::StateQueryUtil::verifyStateIndexedBooleanVec4
                (&local_80,&local_98,0xc23,iVar5,(BVec4 *)&local_d8,this->m_verifierType);
      iVar5 = iVar5 + 1;
    } while (iVar5 < local_e4);
  }
  tcu::TestLog::endSection(local_e0.m_log);
  tcu::ResultCollector::setTestContextResult
            (&local_80,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_98);
  return STOP;
}

Assistant:

ColorMaskCase::IterateResult ColorMaskCase::iterate (void)
{
	glu::CallLogWrapper		gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result			(m_testCtx.getLog(), " // ERROR: ");
	deInt32					maxDrawBuffers = 0;

	gl.enableLogging(true);

	gl.glGetIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "glGetIntegerv");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial value");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedBooleanVec4(result, gl, GL_COLOR_WRITEMASK, ndx, tcu::BVec4(true), m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingCommon", "After setting common");

		gl.glColorMask(GL_FALSE, GL_TRUE, GL_TRUE, GL_FALSE);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedBooleanVec4(result, gl, GL_COLOR_WRITEMASK, ndx, tcu::BVec4(false, true, true, false), m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingIndexed", "After setting indexed");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glColorMaski(ndx, (ndx % 2 == 0 ? GL_TRUE : GL_FALSE), (ndx % 2 == 1 ? GL_TRUE : GL_FALSE), (ndx % 2 == 0 ? GL_TRUE : GL_FALSE), (ndx % 2 == 1 ? GL_TRUE : GL_FALSE));

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedBooleanVec4(result, gl, GL_COLOR_WRITEMASK, ndx, (ndx % 2 == 0 ? tcu::BVec4(true, false, true, false) : tcu::BVec4(false, true, false, true)), m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterResettingIndexedWithCommon", "After resetting indexed with common");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glColorMaski(ndx, (ndx % 2 == 0 ? GL_TRUE : GL_FALSE), (ndx % 2 == 1 ? GL_TRUE : GL_FALSE), (ndx % 2 == 0 ? GL_TRUE : GL_FALSE), (ndx % 2 == 1 ? GL_TRUE : GL_FALSE));

		gl.glColorMask(GL_FALSE, GL_TRUE, GL_TRUE, GL_FALSE);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedBooleanVec4(result, gl, GL_COLOR_WRITEMASK, ndx, tcu::BVec4(false, true, true, false), m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}